

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  _func_void_ggml_backend_t *p_Var1;
  ggml_status gVar2;
  long lVar3;
  
  gVar2 = ggml_backend_sched_graph_compute_async(sched,graph);
  if (0 < sched->n_backends) {
    lVar3 = 0;
    do {
      p_Var1 = (sched->backends[lVar3]->iface).synchronize;
      if (p_Var1 != (_func_void_ggml_backend_t *)0x0) {
        (*p_Var1)(sched->backends[lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < sched->n_backends);
  }
  return gVar2;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    enum ggml_status err = ggml_backend_sched_graph_compute_async(sched, graph);
    ggml_backend_sched_synchronize(sched);
    return err;
}